

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbsessionmanager.cpp
# Opt level: O2

void sm_setProperty(QString *name,QString *value)

{
  char *name_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_70;
  SmPropValue local_58;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = -0x5555555555555556;
  local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  QString::toUtf8_helper((QString *)&local_48);
  local_58._4_4_ = 0xaaaaaaaa;
  local_58.length = (int)local_48.size;
  local_58.value = local_48.ptr;
  if (local_48.ptr == (char *)0x0) {
    local_58.value = &QByteArray::_empty;
  }
  QString::toLatin1_helper((QString *)&local_70);
  name_00 = QByteArray::data((QByteArray *)&local_70);
  sm_setProperty(name_00,"ARRAY8",1,&local_58);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void sm_setProperty(const QString &name, const QString &value)
{
    QByteArray v = value.toUtf8();
    SmPropValue prop;
    prop.length = v.size();
    prop.value = (SmPointer) const_cast<char *>(v.constData());
    sm_setProperty(name.toLatin1().data(), SmARRAY8, 1, &prop);
}